

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::ensureRowwise(HighsSparseMatrix *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  pointer piVar5;
  pointer pdVar6;
  int *piVar7;
  uint uVar8;
  size_type sVar9;
  size_type sVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_type __n;
  vector<int,_std::allocator<int>_> ARlength;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  vector<double,_std::allocator<double>_> Avalue;
  vector<int,_std::allocator<int>_> local_98;
  value_type_conflict2 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if ((this->format_ & ~kColwise) != kRowwise) {
    uVar1 = this->num_col_;
    uVar2 = this->num_row_;
    __n = (size_type)(int)uVar2;
    this_00 = &this->start_;
    uVar8 = uVar2;
    if (this->format_ == kColwise) {
      uVar8 = uVar1;
    }
    iVar11 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar8];
    sVar10 = (size_type)iVar11;
    if (sVar10 == 0) {
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (this_00,__n + 1,(value_type_conflict2 *)&local_60);
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar5) {
        (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = piVar5;
      }
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar6) {
        (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar6;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector(&local_60,this_00);
      __x = &this->index_;
      std::vector<int,_std::allocator<int>_>::vector(&local_78,__x);
      __x_00 = &this->value_;
      std::vector<double,_std::allocator<double>_>::vector(&local_48,__x_00);
      std::vector<int,_std::allocator<int>_>::resize(this_00,__n + 1);
      std::vector<int,_std::allocator<int>_>::resize(__x,sVar10);
      std::vector<double,_std::allocator<double>_>::resize(__x_00,sVar10);
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_7c = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_98,__n,&local_7c);
      piVar7 = (int *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_);
      sVar9 = (size_type)*piVar7;
      if (*piVar7 < iVar11) {
        do {
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar9]] =
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[sVar9]] + 1;
          sVar9 = sVar9 + 1;
        } while (sVar10 != sVar9);
      }
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *piVar4 = 0;
      if (0 < (int)uVar2) {
        iVar11 = *piVar4;
        sVar10 = 0;
        do {
          iVar11 = iVar11 + local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[sVar10];
          piVar4[sVar10 + 1] = iVar11;
          sVar10 = sVar10 + 1;
        } while (__n != sVar10);
      }
      if (0 < (int)uVar1) {
        piVar5 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          lVar14 = (long)piVar7[uVar12];
          uVar13 = uVar12 + 1;
          if (piVar7[uVar12] < piVar7[uVar12 + 1]) {
            do {
              iVar11 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
              iVar3 = piVar4[iVar11];
              piVar5[iVar3] = (int)uVar12;
              pdVar6[iVar3] =
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
              piVar4[iVar11] = piVar4[iVar11] + 1;
              lVar14 = lVar14 + 1;
            } while (lVar14 < piVar7[uVar13]);
          }
          uVar12 = uVar13;
        } while (uVar13 != uVar1);
      }
      *piVar4 = 0;
      if (0 < (int)uVar2) {
        iVar11 = *piVar4;
        sVar10 = 0;
        do {
          iVar11 = iVar11 + local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[sVar10];
          piVar4[sVar10 + 1] = iVar11;
          sVar10 = sVar10 + 1;
        } while (__n != sVar10);
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_60.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
    }
    this->format_ = kRowwise;
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isRowwise() const {
  return this->format_ == MatrixFormat::kRowwise ||
         this->format_ == MatrixFormat::kRowwisePartitioned;
}